

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O2

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::remove_timer(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
               *this,per_timer_data *timer)

{
  pointer *pphVar1;
  pointer phVar2;
  pointer phVar3;
  ulong index1;
  per_timer_data *ppVar4;
  per_timer_data *ppVar5;
  ulong uVar6;
  size_t index2;
  
  phVar2 = (this->heap_).
           super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  phVar3 = (this->heap_).
           super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (phVar2 != phVar3) {
    index1 = timer->heap_index_;
    uVar6 = (long)phVar3 - (long)phVar2 >> 4;
    if (index1 < uVar6) {
      index2 = uVar6 - 1;
      if (index1 == index2) {
        (this->heap_).
        super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish = phVar3 + -1;
      }
      else {
        swap_heap(this,index1,index2);
        pphVar1 = &(this->heap_).
                   super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pphVar1 = *pphVar1 + -1;
        if ((index1 == 0) ||
           (phVar2 = (this->heap_).
                     super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           phVar2[index1 - 1 >> 1].time_.__d.__r <= phVar2[index1].time_.__d.__r)) {
          down_heap(this,index1);
        }
        else {
          up_heap(this,index1);
        }
      }
    }
  }
  if (this->timers_ == timer) {
    this->timers_ = timer->next_;
  }
  ppVar4 = timer->next_;
  ppVar5 = timer->prev_;
  if (ppVar5 != (per_timer_data *)0x0) {
    ppVar5->next_ = ppVar4;
  }
  if (ppVar4 != (per_timer_data *)0x0) {
    ppVar4->prev_ = ppVar5;
  }
  timer->next_ = (per_timer_data *)0x0;
  timer->prev_ = (per_timer_data *)0x0;
  return;
}

Assistant:

void remove_timer(per_timer_data& timer)
  {
    // Remove the timer from the heap.
    std::size_t index = timer.heap_index_;
    if (!heap_.empty() && index < heap_.size())
    {
      if (index == heap_.size() - 1)
      {
        heap_.pop_back();
      }
      else
      {
        swap_heap(index, heap_.size() - 1);
        heap_.pop_back();
        if (index > 0 && Time_Traits::less_than(
              heap_[index].time_, heap_[(index - 1) / 2].time_))
          up_heap(index);
        else
          down_heap(index);
      }
    }

    // Remove the timer from the linked list of active timers.
    if (timers_ == &timer)
      timers_ = timer.next_;
    if (timer.prev_)
      timer.prev_->next_ = timer.next_;
    if (timer.next_)
      timer.next_->prev_= timer.prev_;
    timer.next_ = 0;
    timer.prev_ = 0;
  }